

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O0

BitmapImage * __thiscall phosg::BitmapImage::operator=(BitmapImage *this,BitmapImage *im)

{
  BitmapImage *im_local;
  BitmapImage *this_local;
  
  this->width = im->width;
  this->height = im->height;
  this->row_bytes = im->row_bytes;
  if ((this->data != (uint8_t *)0x0) && (this->data != (uint8_t *)0x0)) {
    operator_delete__(this->data);
  }
  this->data = im->data;
  im->width = 0;
  im->height = 0;
  im->row_bytes = 0;
  im->data = (uint8_t *)0x0;
  return this;
}

Assistant:

BitmapImage& BitmapImage::operator=(BitmapImage&& im) {
  this->width = im.width;
  this->height = im.height;
  this->row_bytes = im.row_bytes;
  if (this->data) {
    delete[] this->data;
  }
  this->data = im.data;
  im.width = 0;
  im.height = 0;
  im.row_bytes = 0;
  im.data = nullptr;
  return *this;
}